

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

void BinaryenStructNewSetOperandAt
               (BinaryenExpressionRef expr,BinaryenIndex index,BinaryenExpressionRef operandExpr)

{
  if (expr->_id != StructNewId) {
    __assert_fail("expression->is<StructNew>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x1049,
                  "void BinaryenStructNewSetOperandAt(BinaryenExpressionRef, BinaryenIndex, BinaryenExpressionRef)"
                 );
  }
  if ((ulong)index < expr[1].type.id) {
    if (operandExpr != (BinaryenExpressionRef)0x0) {
      *(BinaryenExpressionRef *)(*(long *)(expr + 1) + (ulong)index * 8) = operandExpr;
      return;
    }
    __assert_fail("operandExpr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x104b,
                  "void BinaryenStructNewSetOperandAt(BinaryenExpressionRef, BinaryenIndex, BinaryenExpressionRef)"
                 );
  }
  __assert_fail("index < static_cast<StructNew*>(expression)->operands.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x104a,
                "void BinaryenStructNewSetOperandAt(BinaryenExpressionRef, BinaryenIndex, BinaryenExpressionRef)"
               );
}

Assistant:

void BinaryenStructNewSetOperandAt(BinaryenExpressionRef expr,
                                   BinaryenIndex index,
                                   BinaryenExpressionRef operandExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<StructNew>());
  assert(index < static_cast<StructNew*>(expression)->operands.size());
  assert(operandExpr);
  static_cast<StructNew*>(expression)->operands[index] =
    (Expression*)operandExpr;
}